

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,3ul>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,array<int,_3UL> *v,
               ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  const_iterator pvVar1;
  BasicWriter<char> *in_RDI;
  size_t in_stack_00000020;
  ItemNamer *in_stack_00000028;
  value_type *el;
  const_iterator __end0;
  const_iterator __begin0;
  array<int,_3UL> *__range2;
  int n;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  const_iterator pvVar2;
  const_iterator local_30;
  int local_1c;
  
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  local_1c = -1;
  local_30 = std::array<int,_3UL>::begin((array<int,_3UL> *)0x2abbfe);
  pvVar1 = std::array<int,_3UL>::end((array<int,_3UL> *)0x2abc0d);
  for (; local_30 != pvVar1; local_30 = local_30 + 1) {
    local_1c = local_1c + 1;
    pvVar2 = local_30;
    if (local_1c != 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      value.size_ = (size_t)pvVar2;
      value.data_ = in_stack_ffffffffffffffb8;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value);
    }
    in_stack_ffffffffffffff90 = in_RDI;
    ItemNamer::at(in_stack_00000028,in_stack_00000020);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    value_00.size_ = (size_t)pvVar2;
    value_00.data_ = in_stack_ffffffffffffffb8;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_00);
  }
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}